

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O3

void obj_stop_timers(obj *obj)

{
  timer_element *ptVar1;
  obj *arg;
  timer_element *ptVar2;
  timer_element *ptVar3;
  timer_element *__ptr;
  
  __ptr = obj->olev->lev_timers;
  if (__ptr != (timer_element *)0x0) {
    ptVar3 = (timer_element *)0x0;
    do {
      ptVar1 = __ptr->next;
      if ((__ptr->kind == 2) && (arg = (obj *)__ptr->arg, arg == obj)) {
        ptVar2 = ptVar3;
        if (ptVar3 == (timer_element *)0x0) {
          ptVar2 = (timer_element *)&obj->olev->lev_timers;
        }
        ptVar2->next = ptVar1;
        if (__ptr->func_index == '\x03') {
          cleanup_burn(arg,(ulong)__ptr->timeout);
        }
        free(__ptr);
        __ptr = ptVar3;
      }
      ptVar3 = __ptr;
      __ptr = ptVar1;
    } while (ptVar1 != (timer_element *)0x0);
  }
  obj->timed = '\0';
  return;
}

Assistant:

void obj_stop_timers(struct obj *obj)
{
    timer_element *curr, *prev, *next_timer=0;

    for (prev = 0, curr = obj->olev->lev_timers; curr; curr = next_timer) {
	next_timer = curr->next;
	if (curr->kind == TIMER_OBJECT && curr->arg == obj) {
	    if (prev)
		prev->next = curr->next;
	    else
		obj->olev->lev_timers = curr->next;
	    if (timeout_funcs[curr->func_index].cleanup)
		(*timeout_funcs[curr->func_index].cleanup)(curr->arg, curr->timeout);
	    free(curr);
	} else {
	    prev = curr;
	}
    }
    obj->timed = 0;
}